

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvstate.c
# Opt level: O0

int quicly_recvstate_reset(quicly_recvstate_t *state,uint64_t eos_at,uint64_t *bytes_missing)

{
  int iVar1;
  long *in_RDX;
  ulong in_RSI;
  quicly_recvstate_t *in_RDI;
  int local_4;
  
  iVar1 = quicly_recvstate_transfer_complete(in_RDI);
  if (iVar1 == 0) {
    if ((in_RDI->eos == 0xffffffffffffffff) || (in_RDI->eos == in_RSI)) {
      if (in_RSI < (in_RDI->received).ranges[(in_RDI->received).num_ranges - 1].end) {
        local_4 = 0x20006;
      }
      else {
        *in_RDX = in_RSI - (in_RDI->received).ranges[(in_RDI->received).num_ranges - 1].end;
        quicly_ranges_clear((quicly_ranges_t *)0x14ba41);
        local_4 = 0;
      }
    }
    else {
      local_4 = 0x20006;
    }
    return local_4;
  }
  __assert_fail("!quicly_recvstate_transfer_complete(state)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/recvstate.c"
                ,0x60,"int quicly_recvstate_reset(quicly_recvstate_t *, uint64_t, uint64_t *)");
}

Assistant:

int quicly_recvstate_reset(quicly_recvstate_t *state, uint64_t eos_at, uint64_t *bytes_missing)
{
    assert(!quicly_recvstate_transfer_complete(state));

    /* validate */
    if (state->eos != UINT64_MAX && state->eos != eos_at)
        return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
    if (eos_at < state->received.ranges[state->received.num_ranges - 1].end)
        return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;

    /* calculate bytes missing */
    *bytes_missing = eos_at - state->received.ranges[state->received.num_ranges - 1].end;

    /* clear the received range */
    quicly_ranges_clear(&state->received);

    return 0;
}